

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O1

configInfo * glcts::parseConfigBitsFromName(configInfo *__return_storage_ptr__,char *configName)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::colorCfgs[0].name + lVar6);
    sVar5 = strlen(pcVar1);
    iVar4 = strncmp(configName,pcVar1,sVar5);
    if (iVar4 == 0) {
      uVar2 = *(undefined8 *)((long)&parseConfigBitsFromName::colorCfgs[0].redBits + lVar6);
      uVar3 = *(undefined8 *)((long)&parseConfigBitsFromName::colorCfgs[0].blueBits + lVar6);
      __return_storage_ptr__->redBits = (int)uVar2;
      __return_storage_ptr__->greenBits = (int)((ulong)uVar2 >> 0x20);
      __return_storage_ptr__->blueBits = (int)uVar3;
      __return_storage_ptr__->alphaBits = (int)((ulong)uVar3 >> 0x20);
      configName = configName + sVar5;
      break;
    }
    lVar6 = lVar6 + 0x18;
  } while (lVar6 == 0x18);
  lVar6 = 0;
  do {
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::depthCfgs[0].name + lVar6);
    sVar5 = strlen(pcVar1);
    iVar4 = strncmp(configName,pcVar1,sVar5);
    if (iVar4 == 0) {
      __return_storage_ptr__->depthBits =
           *(deInt32 *)((long)&parseConfigBitsFromName::depthCfgs[0].depthBits + lVar6);
      configName = configName + sVar5;
      break;
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 == 0x10);
  lVar6 = 0;
  do {
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::stencilCfgs[0].name + lVar6);
    sVar5 = strlen(pcVar1);
    iVar4 = strncmp(configName,pcVar1,sVar5);
    if (iVar4 == 0) {
      __return_storage_ptr__->stencilBits =
           *(deInt32 *)((long)&parseConfigBitsFromName::stencilCfgs[0].stencilBits + lVar6);
      configName = configName + sVar5;
      break;
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 == 0x10);
  lVar6 = 0;
  do {
    pcVar1 = *(char **)((long)&parseConfigBitsFromName::multiSampleCfgs[0].name + lVar6);
    sVar5 = strlen(pcVar1);
    iVar4 = strncmp(configName,pcVar1,sVar5);
    if (iVar4 == 0) {
      __return_storage_ptr__->samples =
           *(deInt32 *)((long)&parseConfigBitsFromName::multiSampleCfgs[0].samples + lVar6);
      return __return_storage_ptr__;
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 == 0x10);
  return __return_storage_ptr__;
}

Assistant:

static configInfo parseConfigBitsFromName(const char* configName)
{
	configInfo cfgInfo;
	static const struct
	{
		const char* name;
		int			redBits;
		int			greenBits;
		int			blueBits;
		int			alphaBits;
	} colorCfgs[] = {
		{ "rgba8888", 8, 8, 8, 8 }, { "rgb565", 5, 6, 5, 0 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorCfgs); ndx++)
	{
		if (!strncmp(configName, colorCfgs[ndx].name, strlen(colorCfgs[ndx].name)))
		{
			cfgInfo.redBits   = colorCfgs[ndx].redBits;
			cfgInfo.greenBits = colorCfgs[ndx].greenBits;
			cfgInfo.blueBits  = colorCfgs[ndx].blueBits;
			cfgInfo.alphaBits = colorCfgs[ndx].alphaBits;

			configName += strlen(colorCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			depthBits;
	} depthCfgs[] = {
		{ "d0", 0 }, { "d24", 24 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthCfgs); ndx++)
	{
		if (!strncmp(configName, depthCfgs[ndx].name, strlen(depthCfgs[ndx].name)))
		{
			cfgInfo.depthBits = depthCfgs[ndx].depthBits;

			configName += strlen(depthCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			stencilBits;
	} stencilCfgs[] = {
		{ "s0", 0 }, { "s8", 8 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilCfgs); ndx++)
	{
		if (!strncmp(configName, stencilCfgs[ndx].name, strlen(stencilCfgs[ndx].name)))
		{
			cfgInfo.stencilBits = stencilCfgs[ndx].stencilBits;

			configName += strlen(stencilCfgs[ndx].name);
			break;
		}
	}

	static const struct
	{
		const char* name;
		int			samples;
	} multiSampleCfgs[] = {
		{ "ms0", 0 }, { "ms4", 4 },
	};
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(multiSampleCfgs); ndx++)
	{
		if (!strncmp(configName, multiSampleCfgs[ndx].name, strlen(multiSampleCfgs[ndx].name)))
		{
			cfgInfo.samples = multiSampleCfgs[ndx].samples;

			configName += strlen(multiSampleCfgs[ndx].name);
			break;
		}
	}

	return cfgInfo;
}